

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O0

void __thiscall
icu_63::DateFormatSymbols::createZoneStrings(DateFormatSymbols *this,UnicodeString **otherStrings)

{
  UnicodeString *pUVar1;
  bool bVar2;
  UnicodeString **ppUVar3;
  UnicodeString *src;
  UnicodeString *this_00;
  int local_28;
  int i;
  int iStack_1c;
  UBool failed;
  int32_t col;
  int32_t row;
  UnicodeString **otherStrings_local;
  DateFormatSymbols *this_local;
  
  bVar2 = false;
  src = (UnicodeString *)otherStrings;
  ppUVar3 = (UnicodeString **)uprv_malloc_63((long)this->fZoneStringsRowCount << 3);
  this->fZoneStrings = ppUVar3;
  if (this->fZoneStrings != (UnicodeString **)0x0) {
    for (iStack_1c = 0; iStack_1c < this->fZoneStringsRowCount; iStack_1c = iStack_1c + 1) {
      src = newUnicodeStringArray((long)this->fZoneStringsColCount);
      this->fZoneStrings[iStack_1c] = src;
      if (this->fZoneStrings[iStack_1c] == (UnicodeString *)0x0) {
        bVar2 = true;
        break;
      }
      for (i = 0; i < this->fZoneStringsColCount; i = i + 1) {
        src = otherStrings[iStack_1c] + i;
        icu_63::UnicodeString::fastCopyFrom(this->fZoneStrings[iStack_1c] + i,src);
      }
    }
  }
  if (bVar2) {
    for (local_28 = iStack_1c; -1 < local_28; local_28 = local_28 + -1) {
      pUVar1 = this->fZoneStrings[local_28];
      if (pUVar1 != (UnicodeString *)0x0) {
        this_00 = pUVar1 + *(long *)((long)&pUVar1[-1].fUnion + 0x30);
        while (pUVar1 != this_00) {
          this_00 = this_00 + -1;
          icu_63::UnicodeString::~UnicodeString(this_00);
        }
        UMemory::operator_delete__((UMemory *)((long)&pUVar1[-1].fUnion + 0x30),src);
      }
    }
    uprv_free_63(this->fZoneStrings);
    this->fZoneStrings = (UnicodeString **)0x0;
  }
  return;
}

Assistant:

void
DateFormatSymbols::createZoneStrings(const UnicodeString *const * otherStrings)
{
    int32_t row, col;
    UBool failed = FALSE;

    fZoneStrings = (UnicodeString **)uprv_malloc(fZoneStringsRowCount * sizeof(UnicodeString *));
    if (fZoneStrings != NULL) {
        for (row=0; row<fZoneStringsRowCount; ++row)
        {
            fZoneStrings[row] = newUnicodeStringArray(fZoneStringsColCount);
            if (fZoneStrings[row] == NULL) {
                failed = TRUE;
                break;
            }
            for (col=0; col<fZoneStringsColCount; ++col) {
                // fastCopyFrom() - see assignArray comments
                fZoneStrings[row][col].fastCopyFrom(otherStrings[row][col]);
            }
        }
    }
    // If memory allocation failed, roll back and delete fZoneStrings
    if (failed) {
        for (int i = row; i >= 0; i--) {
            delete[] fZoneStrings[i];
        }
        uprv_free(fZoneStrings);
        fZoneStrings = NULL;
    }
}